

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

void __thiscall helics::BrokerApp::BrokerApp(BrokerApp *this,string_view argString)

{
  string_view brokerName;
  bool bVar1;
  ParseOutput PVar2;
  size_type sVar3;
  element_type *peVar4;
  pointer this_00;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *in_RDX;
  __shared_ptr *in_RDI;
  BrokerApp *unaff_retaddr;
  bool in_stack_00000037;
  BrokerApp *in_stack_00000038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  helicsCLI11App *in_stack_00000050;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffd8;
  
  CLI::std::shared_ptr<helics::Broker>::shared_ptr((shared_ptr<helics::Broker> *)0x4477d1);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
                     (char)((uint)in_stack_ffffffffffffff5c >> 0x18),0x4477fa);
  if (sVar3 == 0xffffffffffffffff) {
    brokerName._M_str = in_stack_ffffffffffffffd8;
    brokerName._M_len = (size_t)in_RDX;
    BrokerFactory::findBroker(brokerName);
    CLI::std::shared_ptr<helics::Broker>::operator=
              ((shared_ptr<helics::Broker> *)in_stack_ffffffffffffff60,
               (shared_ptr<helics::Broker> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x447849);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
    if (bVar1) {
      peVar4 = CLI::std::
               __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x447863);
      (*peVar4->_vptr_Broker[0xb])();
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff60,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      return;
    }
  }
  generateParser(in_stack_00000038,in_stack_00000037);
  this_00 = CLI::std::
            unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
            operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x4478c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  PVar2 = helicsCLI11App::helics_parse<std::__cxx11::string>(in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_71);
  if (PVar2 == OK) {
    processArgs(unaff_retaddr,in_RDX);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              in_stack_ffffffffffffff70);
  return;
}

Assistant:

BrokerApp::BrokerApp(std::string_view argString)
{
    if (argString.find_first_of('-') == std::string_view::npos) {
        broker = BrokerFactory::findBroker(argString);
        if (broker) {
            name = broker->getIdentifier();
            return;
        }
    }
    auto app = generateParser();
    if (app->helics_parse(std::string(argString)) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}